

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O2

void __thiscall Solution::print(Solution *this)

{
  ostream *poVar1;
  iterator __end1;
  long *plVar2;
  long *plVar3;
  list<Point_*,_std::allocator<Point_*>_> *plVar4;
  shared_ptr<VehicleState> node;
  __shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2> local_50;
  Solution *local_40;
  Solution *local_38;
  
  plVar4 = &Utils::raw_rows_abi_cxx11_;
  while (plVar4 = (list<Point_*,_std::allocator<Point_*>_> *)
                  (plVar4->super__List_base<Point_*,_std::allocator<Point_*>_>)._M_impl._M_node.
                  super__List_node_base._M_next, plVar4 != &Utils::raw_rows_abi_cxx11_) {
    local_50._M_ptr = (element_type *)this;
    std::
    _Hashtable<Solution_*,_std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Solution_*>,_std::hash<Solution_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase((_Hashtable<Solution_*,_std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Solution_*>,_std::hash<Solution_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)(*(long *)((long)plVar4 + 0x10) + 0x20),&local_50);
  }
  local_40 = this;
  while (local_38 = (Solution *)
                    (this->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl
                    ._M_node.super__List_node_base._M_next, local_38 != local_40) {
    plVar2 = (long *)((local_38->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>.
                      _M_impl._M_node._M_size + 8);
    plVar3 = plVar2;
    while (plVar3 = (long *)*plVar3, plVar3 != plVar2) {
      std::__shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,(__shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2> *)(plVar3 + 2));
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          *(int *)&((((list<Vehicle_*,_std::allocator<Vehicle_*>_> *)
                                     &(local_50._M_ptr)->p)->
                                    super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>)._M_impl
                                    ._M_node.super__List_node_base._M_next)->_M_next);
      std::operator<<(poVar1," ");
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    }
    std::operator<<((ostream *)&std::cout,"\n");
    this = local_38;
  }
  return;
}

Assistant:

void Solution::print() {
    for (auto point: Utils::raw_rows) {
        point->state.erase(this);
    }

    for (auto vehicle: vehicles) {
        for (auto node: vehicle->nodes) {
            std::cout << node->p->id << " ";
        }
        std::cout << "\n";
    }
}